

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandMuxes(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *format;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pAVar2 == (Abc_Ntk_t *)0x0) {
      format = "Empty network.\n";
    }
    else if ((pAVar2->ntkFunc == ABC_FUNC_BDD) && (pAVar2->ntkType == ABC_NTK_LOGIC)) {
      pAVar2 = Abc_NtkBddToMuxes(pAVar2);
      if (pAVar2 != (Abc_Ntk_t *)0x0) {
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
        return 0;
      }
      format = "Converting to MUXes has failed.\n";
    }
    else {
      format = "Only a BDD logic network can be converted to MUXes.\n";
    }
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: muxes [-h]\n");
    Abc_Print(-2,"\t        converts the current network into a network derived by\n");
    Abc_Print(-2,"\t        replacing all nodes by DAGs isomorphic to the local BDDs\n");
    format = "\t-h    : print the command usage\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,format);
  return 1;
}

Assistant:

int Abc_CommandMuxes( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsBddLogic(pNtk) )
    {
        Abc_Print( -1, "Only a BDD logic network can be converted to MUXes.\n" );
        return 1;
    }

    // get the new network
    pNtkRes = Abc_NtkBddToMuxes( pNtk );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Converting to MUXes has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: muxes [-h]\n" );
    Abc_Print( -2, "\t        converts the current network into a network derived by\n" );
    Abc_Print( -2, "\t        replacing all nodes by DAGs isomorphic to the local BDDs\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}